

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  lys_node *plVar8;
  lys_node *plVar9;
  LY_ERR *pLVar10;
  ly_set *set;
  lys_module *module;
  lyd_node **pplVar11;
  lyd_node *plVar12;
  lyd_node *plVar13;
  lyd_node *plVar14;
  lyd_node *plVar15;
  LYS_NODE LVar16;
  lyd_node *plVar17;
  int iVar18;
  bool bVar19;
  int local_48;
  lyd_node *local_40;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xd9a,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar17 = *sibling;
    do {
      local_40 = plVar17;
      plVar17 = local_40->prev;
    } while (local_40->prev->next != (lyd_node *)0x0);
  }
  else {
    local_40 = parent->child;
  }
  if (local_40 == (lyd_node *)0x0) {
    if (parent == (lyd_node *)0x0) {
      if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
        lyd_unlink_internal(node,1);
      }
      *sibling = node;
      return 0;
    }
    plVar8 = parent->schema;
    LVar16 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar8->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
      LVar16 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    }
  }
  else {
    if (parent != (lyd_node *)0x0) {
      plVar8 = parent->schema;
      LVar16 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar8->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_001610ed;
    }
    plVar8 = lys_parent(local_40->schema);
    for (; LVar16 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER, plVar8 != (lys_node *)0x0
        ; plVar8 = lys_parent(plVar8)) {
      if ((plVar8->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
          LYS_UNKNOWN) goto LAB_001610ed;
    }
    plVar8 = (lys_node *)0x0;
  }
LAB_001610ed:
  plVar9 = node->schema;
  do {
    plVar9 = lys_parent(plVar9);
    if (plVar9 == (lys_node *)0x0) break;
  } while ((plVar9->nodetype & LVar16) == LYS_UNKNOWN);
  if (plVar8 == plVar9) {
    local_31 = '\x01';
    local_48 = 0;
    if ((invalidate != 0) &&
       ((iVar6 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
        (iVar6 != 0 || node->parent != parent)))) {
      local_48 = iVar6 + 1;
      local_31 = iVar6 == 0;
    }
    if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
      lyd_unlink_internal(node,local_48);
    }
    set = (ly_set *)calloc(1,0x10);
    bVar4 = false;
LAB_001611e5:
    plVar17 = node;
    if (plVar17 != (lyd_node *)0x0) {
      node = plVar17->next;
      if ((local_48 != 1) ||
         (iVar6 = lyv_multicases(plVar17,(lys_node *)0x0,&local_40,1,(lyd_node *)0x0), iVar6 == 0))
      {
        bVar5 = plVar17->field_0x9 & 1;
        if (bVar5 == 0) {
          bVar4 = true;
        }
        plVar17->prev = plVar17;
        plVar17->next = (lyd_node *)0x0;
        if ((((parent == (lyd_node *)0x0) || (bVar5 != 0)) ||
            (((lys_node_list *)parent->schema)->nodetype != LYS_LIST)) ||
           ((((lys_node_leaf *)plVar17->schema)->nodetype != LYS_LEAF ||
            (iVar6 = lys_is_key((lys_node_list *)parent->schema,(lys_node_leaf *)plVar17->schema),
            iVar6 == 0)))) {
          plVar8 = plVar17->schema;
          LVar16 = plVar8->nodetype;
          if (LVar16 == LYS_CONTAINER) {
            lVar2._0_2_ = plVar8[1].flags;
            lVar2._2_1_ = plVar8[1].ext_size;
            lVar2._3_1_ = plVar8[1].iffeature_size;
            lVar2._4_1_ = plVar8[1].padding[0];
            lVar2._5_1_ = plVar8[1].padding[1];
            lVar2._6_1_ = plVar8[1].padding[2];
            lVar2._7_1_ = plVar8[1].padding[3];
            if (local_40 != (lyd_node *)0x0 && lVar2 == 0) {
LAB_00161369:
              bVar3 = true;
              plVar13 = local_40;
LAB_0016136b:
              if (plVar13->schema != plVar8) goto code_r0x00161374;
              if (((plVar17->field_0x9 & 1) != 0) || ((plVar13->field_0x9 & 1) != 0)) {
                plVar12 = plVar17;
                if ((plVar17->parent == (lyd_node *)0x0) && (plVar17->prev->next == (lyd_node *)0x0)
                   ) {
                  for (plVar15 = plVar17->next; plVar15 != (lyd_node *)0x0; plVar15 = plVar15->next)
                  {
                    plVar12->parent = plVar13->parent;
                    plVar12 = plVar15;
                  }
                }
                else {
                  plVar17->next = (lyd_node *)0x0;
                  plVar17->prev = plVar17;
                }
                plVar15 = plVar13->parent;
                if (plVar15 != (lyd_node *)0x0) {
                  if (plVar15->child == plVar13) {
                    plVar15->child = plVar17;
                  }
                  plVar13->parent = (lyd_node *)0x0;
                }
                plVar15 = plVar13->prev;
                if (plVar15 != plVar13) {
                  if (plVar15->next != (lyd_node *)0x0) {
                    plVar15->next = plVar17;
                  }
                  plVar17->prev = plVar15;
                  plVar13->prev = plVar13;
                  plVar15 = plVar13->next;
                  if (plVar15 == (lyd_node *)0x0) {
                    plVar15 = plVar17;
                    if (plVar17->parent == (lyd_node *)0x0) {
                      do {
                        plVar14 = plVar15;
                        plVar15 = plVar14->prev;
                      } while (plVar15 != plVar13);
                      plVar14->prev = plVar12;
                    }
                    else {
                      plVar17->parent->child->prev = plVar12;
                    }
                  }
                  else {
                    plVar15->prev = plVar12;
                    plVar12->next = plVar15;
                    plVar13->next = (lyd_node *)0x0;
                  }
                }
                lyd_free(plVar13);
                goto LAB_001615cf;
              }
              goto LAB_0016140f;
            }
          }
          else if (LVar16 == LYS_LEAF) {
            if (local_40 != (lyd_node *)0x0) goto LAB_00161369;
          }
          else if ((LVar16 == LYS_LEAFLIST) &&
                  ((uVar1 = set->number, uVar7 = ly_set_add(set,plVar8,0), plVar13 = local_40,
                   uVar7 != uVar1 || ((plVar17->field_0x9 & 1) != 0)))) {
LAB_00161386:
            do {
              plVar12 = plVar13;
              if (plVar12 == (lyd_node *)0x0) break;
              plVar13 = plVar12->next;
              if (plVar12->schema == plVar17->schema) {
                bVar5 = plVar17->field_0x9;
                if ((bVar5 & 1) == 0) {
LAB_001613b0:
                  if ((plVar12->field_0x9 & 1) == 0) goto LAB_00161386;
                }
                else if (((plVar12->field_0x9 & 1) != 0) &&
                        (((plVar12->schema->flags & 1) == 0 ||
                         (iVar6 = strcmp((char *)plVar12->child,(char *)plVar17->child), iVar6 != 0)
                         ))) {
                  if ((bVar5 & 1) == 0) goto LAB_001613b0;
                  goto LAB_00161386;
                }
                if (plVar12 == local_40) {
                  local_40 = plVar13;
                }
                lyd_free(plVar12);
              }
            } while( true );
          }
          bVar3 = true;
        }
        else {
          plVar13 = parent->child;
          bVar19 = plVar13 != (lyd_node *)0x0;
          if (((bVar19) && (1 < iVar6)) && (plVar13->schema->nodetype == LYS_LEAF)) {
            iVar18 = 1;
            do {
              plVar13 = plVar13->next;
              bVar19 = plVar13 != (lyd_node *)0x0;
              if ((plVar13 == (lyd_node *)0x0) || (iVar6 + -1 <= iVar18)) break;
              iVar18 = iVar18 + 1;
            } while (plVar13->schema->nodetype == LYS_LEAF);
          }
          bVar3 = true;
          if (bVar19) {
            if (parent->child == plVar13) {
              parent->child = plVar17;
            }
            plVar12 = plVar13->prev;
            if (plVar12->next != (lyd_node *)0x0) {
              plVar12->next = plVar17;
            }
            plVar17->prev = plVar12;
            plVar13->prev = plVar17;
            plVar17->next = plVar13;
            if (parent->child != local_40) {
              local_40 = parent->child;
            }
LAB_001615cf:
            bVar3 = false;
          }
        }
LAB_0016140f:
        if (bVar3) {
          if (local_40 == (lyd_node *)0x0) {
            local_40 = plVar17;
            if (parent != (lyd_node *)0x0) {
              parent->child = plVar17;
            }
            goto LAB_001615fa;
          }
          if (local_31 != '\0') {
            plVar13 = local_40->prev;
            plVar13->next = plVar17;
            plVar17->prev = plVar13;
            local_40->prev = plVar17;
            goto LAB_001615fa;
          }
          plVar8 = plVar17->schema->parent;
          bVar5 = *(byte *)((long)&plVar8->nodetype + 1);
          plVar13 = local_40;
          while (local_40 = plVar13, (bVar5 & 6) == 0) {
            plVar8 = lys_parent(plVar8);
            plVar13 = local_40;
            bVar5 = *(byte *)((long)&plVar8->nodetype + 1);
          }
          if (plVar13 != (lyd_node *)0x0) {
            plVar9 = (lys_node *)0x0;
LAB_00161481:
            do {
              module = lys_node_module(plVar8);
              plVar9 = lys_getnext(plVar9,plVar8,module,0);
              if ((plVar9 != (lys_node *)0x0) && (plVar13->schema != plVar9)) {
                if (plVar17->schema != plVar9) goto LAB_00161481;
              }
              if (plVar17->schema == plVar9) {
                if (((plVar9->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
                   (plVar13->schema != plVar9)) goto LAB_00161590;
                goto LAB_00161579;
              }
              plVar13 = plVar13->next;
            } while (plVar13 != (lyd_node *)0x0);
          }
          goto LAB_001614bd;
        }
        goto LAB_001615fa;
      }
      ly_set_free(set);
      goto LAB_00161115;
    }
    ly_set_free(set);
    if (parent != (lyd_node *)0x0 && bVar4) {
      do {
        if ((parent->field_0x9 & 1) == 0) break;
        parent->field_0x9 = parent->field_0x9 & 0xfe;
        parent = parent->parent;
      } while (parent != (lyd_node *)0x0);
    }
    iVar6 = 0;
    if (sibling != (lyd_node **)0x0) {
      *sibling = local_40;
      iVar6 = 0;
    }
  }
  else {
    pLVar10 = ly_errno_location();
    *pLVar10 = LY_EINVAL;
LAB_00161115:
    iVar6 = 1;
  }
  return iVar6;
code_r0x00161374:
  plVar13 = plVar13->next;
  if (plVar13 == (lyd_node *)0x0) goto LAB_0016140f;
  goto LAB_0016136b;
  while (plVar13 = plVar13->next, plVar13 != (lyd_node *)0x0) {
LAB_00161579:
    if (plVar13->schema != plVar9) goto LAB_00161590;
  }
LAB_001614bd:
  plVar13 = local_40->prev;
  plVar13->next = plVar17;
  plVar17->prev = plVar13;
  local_40->prev = plVar17;
  goto LAB_001615fa;
LAB_00161590:
  if (plVar13 == local_40) {
    pplVar11 = &parent->child;
    local_40 = plVar17;
    if (parent != (lyd_node *)0x0) goto LAB_001615e3;
  }
  else {
    pplVar11 = &plVar13->prev->next;
LAB_001615e3:
    *pplVar11 = plVar17;
  }
  plVar17->prev = plVar13->prev;
  plVar13->prev = plVar17;
  plVar17->next = plVar13;
LAB_001615fa:
  plVar17->parent = parent;
  if (invalidate != 0) {
    check_leaf_list_backlinks(plVar17,0);
  }
  if (local_48 != 0) {
    lyd_insert_setinvalid(plVar17);
  }
  goto LAB_001611e5;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int pos, i;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && parent && parent->schema->nodetype == LYS_LIST && ins->schema->nodetype == LYS_LEAF
                && (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)ins->schema))) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < (pos - 1) && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next) ;
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }
        ins->parent = parent;

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}